

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O2

void __thiscall QThreadPoolPrivate::reset(QThreadPoolPrivate *this)

{
  Span *pSVar1;
  QThread *this_00;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QSet<QThreadPoolThread_*> allThreadsCopy;
  iterator<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> local_48;
  QHash<QThreadPoolThread_*,_QHashDummyValue> local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_48.d;
  local_48 = (iterator<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_>)(auVar2 << 0x40);
  std::__exchange<QSet<QThreadPoolThread*>,QSet<QThreadPoolThread*>>
            ((QSet<QThreadPoolThread_*> *)&local_38,&this->allThreads);
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash
            ((QHash<QThreadPoolThread_*,_QHashDummyValue> *)&local_48);
  QList<QThreadPoolThread_*>::clear(&(this->expiredThreads).super_QList<QThreadPoolThread_*>);
  QList<QThreadPoolThread_*>::clear(&(this->waitingThreads).super_QList<QThreadPoolThread_*>);
  QBasicMutex::unlock(&(this->mutex).super_QBasicMutex);
  local_48 = (iterator<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_>)
             QHash<QThreadPoolThread_*,_QHashDummyValue>::begin(&local_38);
  while( true ) {
    if (local_48.d == (Data<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_> *)0x0 &&
        local_48.bucket == 0) break;
    pSVar1 = (local_48.d)->spans;
    uVar4 = local_48.bucket >> 7;
    this_00 = *(QThread **)
               pSVar1[uVar4].entries[pSVar1[uVar4].offsets[(uint)local_48.bucket & 0x7f]].storage.
               data;
    bVar3 = QThread::isRunning(this_00);
    if (bVar3) {
      QWaitCondition::wakeAll((QWaitCondition *)(this_00 + 1));
      QThread::wait(this_00,(void *)0x7fffffffffffffff);
    }
    (*(this_00->super_QObject)._vptr_QObject[4])(this_00);
    QHashPrivate::iterator<QHashPrivate::Node<QThreadPoolThread_*,_QHashDummyValue>_>::operator++
              (&local_48);
  }
  QBasicMutex::lock(&(this->mutex).super_QBasicMutex);
  QHash<QThreadPoolThread_*,_QHashDummyValue>::~QHash(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QThreadPoolPrivate::reset()
{
    // move the contents of the set out so that we can iterate without the lock
    auto allThreadsCopy = std::exchange(allThreads, {});
    expiredThreads.clear();
    waitingThreads.clear();

    mutex.unlock();

    for (QThreadPoolThread *thread : std::as_const(allThreadsCopy)) {
        if (thread->isRunning()) {
            thread->runnableReady.wakeAll();
            thread->wait();
        }
        delete thread;
    }

    mutex.lock();
}